

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O3

Aig_Man_t *
Dar_ManChoice(Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fConstruct,int nConfMax,
             int nLevelMax,int fVerbose)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *vAigs;
  void **__ptr;
  Aig_Man_t *pAVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  void **ppvVar9;
  uint uVar10;
  timespec local_50;
  int local_40;
  int local_3c;
  void *local_38;
  
  local_3c = nConfMax;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  vAigs = Dar_ManChoiceSynthesis(pAig,fBalance,fUpdateLevel,0,fVerbose);
  iVar2 = (int)pAig;
  if (fConstruct == 0) {
    uVar7 = vAigs->nSize;
    if ((int)uVar7 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    uVar10 = uVar7 - 1;
    local_40 = nLevelMax;
    if (uVar10 == 0) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    __ptr = vAigs->pArray;
    pvVar5 = __ptr[uVar10];
    pvVar1 = *__ptr;
    if (uVar10 == vAigs->nCap) {
      local_38 = pvVar5;
      if (uVar7 < 0x11) {
        ppvVar9 = __ptr;
        __ptr = (void **)realloc(__ptr,0x80);
        iVar2 = (int)ppvVar9;
        uVar7 = 0x10;
      }
      else {
        uVar7 = uVar10 * 2;
        ppvVar9 = __ptr;
        __ptr = (void **)realloc(__ptr,(ulong)uVar7 * 8);
        iVar2 = (int)ppvVar9;
      }
      vAigs->pArray = __ptr;
      vAigs->nCap = uVar7;
      pvVar5 = local_38;
    }
    __ptr[uVar10] = pvVar1;
    *__ptr = pvVar5;
    nLevelMax = local_40;
  }
  if (fVerbose != 0) {
    Abc_Print(iVar2,"%s =","Synthesis time");
    iVar8 = 3;
    iVar2 = clock_gettime(3,&local_50);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar6 + lVar4) / 1000000.0);
  }
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (fConstruct == 0) {
    pAVar3 = Aig_ManChoicePartitioned(vAigs,300,local_3c,nLevelMax,fVerbose);
  }
  else {
    pAVar3 = Aig_ManChoiceConstructive(vAigs,fVerbose);
  }
  if (0 < vAigs->nSize) {
    lVar6 = 0;
    do {
      Aig_ManStop((Aig_Man_t *)vAigs->pArray[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < vAigs->nSize);
  }
  if (vAigs->pArray != (void **)0x0) {
    free(vAigs->pArray);
  }
  free(vAigs);
  if (fVerbose != 0) {
    Abc_Print((int)vAigs,"%s =","Choicing time ");
    iVar8 = 3;
    iVar2 = clock_gettime(3,&local_50);
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar6 + lVar4) / 1000000.0);
  }
  return pAVar3;
}

Assistant:

Aig_Man_t * Dar_ManChoice( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fConstruct, int nConfMax, int nLevelMax, int fVerbose )
{
    Aig_Man_t * pMan, * pTemp;
    Vec_Ptr_t * vAigs;
    int i;
    abctime clk;

clk = Abc_Clock();
//    vAigs = Dar_ManChoiceSynthesisExt();
    vAigs = Dar_ManChoiceSynthesis( pAig, fBalance, fUpdateLevel, 0, fVerbose );

    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    // (it is also important when constructing choices)
    if ( !fConstruct )
    {
        pMan = (Aig_Man_t *)Vec_PtrPop( vAigs );
        Vec_PtrPush( vAigs, Vec_PtrEntry(vAigs,0) );
        Vec_PtrWriteEntry( vAigs, 0, pMan );
    }

if ( fVerbose )
{
ABC_PRT( "Synthesis time", Abc_Clock() - clk );
}
clk = Abc_Clock();
    if ( fConstruct )
        pMan = Aig_ManChoiceConstructive( vAigs, fVerbose );
    else
        pMan = Aig_ManChoicePartitioned( vAigs, 300, nConfMax, nLevelMax, fVerbose );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
if ( fVerbose )
{
ABC_PRT( "Choicing time ", Abc_Clock() - clk );
}
    return pMan;
//    return NULL;
}